

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O0

void __thiscall helics::ipc::IpcComms::queue_tx_function(IpcComms *this)

{
  format_args args;
  format_args args_00;
  bool bVar1;
  uint uVar2;
  ConnectionStatus CVar3;
  __int_type_conflict _Var4;
  int iVar5;
  action_t aVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int in_EDI;
  string_view sVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_bool>
  pVar8;
  iterator routeFnd;
  int priority;
  string buffer;
  ActionMessage op;
  bool newQconnected;
  SendToQueue newQueue;
  ActionMessage cmd;
  route_id rid;
  bool continueLoop;
  bool IPCoperating;
  ActionMessage err_2;
  bool conn;
  ActionMessage err_1;
  ActionMessage err;
  bool conn_1;
  bool hasBroker;
  map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  routes;
  SendToQueue rxQueue;
  SendToQueue brokerQueue;
  ActionMessage *in_stack_fffffffffffff728;
  iterator in_stack_fffffffffffff730;
  pair<helics::route_id,_helics::ActionMessage> *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  int32_t in_stack_fffffffffffff744;
  ActionMessage *in_stack_fffffffffffff748;
  undefined7 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff757;
  SmallBuffer *in_stack_fffffffffffff758;
  int32_t in_stack_fffffffffffff760;
  uint in_stack_fffffffffffff764;
  TriggerVariable *in_stack_fffffffffffff768;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffff770;
  ActionMessage *in_stack_fffffffffffff788;
  _Self local_840;
  _Self local_838;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_7fc;
  _Base_ptr local_740;
  undefined1 local_738;
  undefined1 local_729 [9];
  char *local_720;
  undefined1 local_718 [39];
  byte local_6f1;
  _Alloc_hider in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff990 [12];
  undefined4 in_stack_fffffffffffff99c;
  string_view in_stack_fffffffffffff9a0;
  ActionMessage local_590;
  route_id local_4d8;
  byte local_4d2;
  byte local_4d1;
  char *local_4d0;
  undefined8 local_4c8;
  undefined1 local_4c0 [36];
  undefined4 local_49c;
  int local_3e4;
  duration<long,std::ratio<1l,1000l>> local_3e0 [15];
  byte local_3d1;
  undefined4 local_3cc;
  undefined4 local_314;
  char *local_310;
  undefined8 local_308;
  undefined1 local_300 [36];
  undefined4 local_2dc;
  byte local_212;
  byte local_211;
  SendToQueue local_1e0;
  SendToQueue local_158;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined8 uStack_a0;
  string *local_98;
  char *local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  string *local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SendToQueue::SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
  SendToQueue::SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
  std::
  map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  ::map((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
         *)0x483376);
  local_211 = 0;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x483392);
  if (!bVar1) {
    uVar2 = SendToQueue::connect(&local_158,in_EDI + 0x110,(sockaddr *)0x1,0x14);
    local_212 = (byte)uVar2 & 1;
    if ((uVar2 & 1) == 0) {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffff770);
      uVar2 = SendToQueue::connect(&local_158,in_EDI + 0x110,(sockaddr *)0x1,0x14);
      local_212 = (byte)uVar2 & 1;
      if ((uVar2 & 1) == 0) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                   (action_t)((ulong)in_stack_fffffffffffff748 >> 0x20));
        local_310 = "Unable to open broker connection -> {}";
        local_308 = 0x26;
        local_40 = SendToQueue::getError_abi_cxx11_(&local_158);
        local_28 = local_300;
        local_38 = local_310;
        uStack_30 = local_308;
        local_58 = local_310;
        uStack_50 = local_308;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)
                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff738);
        CVar3 = (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20);
        local_18 = &local_68;
        local_20 = local_78;
        local_68 = 0xd;
        args.field_1._4_4_ = in_stack_fffffffffffff99c;
        args._0_12_ = in_stack_fffffffffffff990;
        local_60 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff9a0,args);
        SmallBuffer::operator=
                  (in_stack_fffffffffffff758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff730._M_node);
        local_2dc = 0xfffffffe;
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff730._M_node,
                   in_stack_fffffffffffff728);
        CommsInterface::setTxStatus
                  ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   CVar3);
        local_314 = 1;
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff730._M_node);
        goto LAB_0048406e;
      }
    }
    local_211 = 1;
  }
  bVar1 = gmlc::concurrency::TriggerVariable::wait_forActivation
                    (in_stack_fffffffffffff768,
                     (milliseconds *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  if (bVar1) {
    CVar3 = CommsInterface::getRxStatus((CommsInterface *)0x483733);
    if (CVar3 == ERRORED) {
      CommsInterface::setTxStatus
                ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20));
      local_314 = 1;
    }
    else {
      uVar2 = SendToQueue::connect(&local_1e0,in_EDI + 0xf0,(sockaddr *)0x0,0);
      local_3d1 = (byte)uVar2 & 1;
      if ((uVar2 & 1) == 0) {
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)in_stack_fffffffffffff738,
                   (__int_type_conflict)((ulong)in_stack_fffffffffffff730._M_node >> 0x20));
        while ((_Var4 = std::__atomic_base::operator_cast_to_int
                                  ((__atomic_base<int> *)in_stack_fffffffffffff738), _Var4 != 0 &&
               (CVar3 = CommsInterface::getRxStatus((CommsInterface *)0x4837e6), CVar3 == CONNECTED)
               )) {
          local_3e4 = 100;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_3e0,&local_3e4)
          ;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffff770);
        }
        CVar3 = CommsInterface::getRxStatus((CommsInterface *)0x483837);
        if (CVar3 == CONNECTED) {
          iVar5 = SendToQueue::connect(&local_1e0,in_EDI + 0xf0,(sockaddr *)0x0,0);
          local_3d1 = (byte)iVar5 & 1;
        }
        if ((local_3d1 & 1) == 0) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                     (action_t)((ulong)in_stack_fffffffffffff748 >> 0x20));
          local_49c = 0xfffffffe;
          local_4d0 = "Unable to open receiver connection -> {}";
          local_4c8 = 0x28;
          local_98 = SendToQueue::getError_abi_cxx11_(&local_1e0);
          local_80 = local_4c0;
          local_90 = local_4d0;
          uStack_88 = local_4c8;
          local_a8 = local_4d0;
          uStack_a0 = local_4c8;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff738);
          CVar3 = (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20);
          local_8 = &local_b8;
          local_10 = local_c8;
          local_b8 = 0xd;
          args_00.field_1._4_4_ = in_stack_fffffffffffff99c;
          args_00._0_12_ = in_stack_fffffffffffff990;
          local_b0 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff9a0,args_00);
          SmallBuffer::operator=
                    (in_stack_fffffffffffff758,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730._M_node);
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff730._M_node,
                     in_stack_fffffffffffff728);
          CommsInterface::setRxStatus
                    ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
                     ,CVar3);
          local_314 = 1;
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff730._M_node);
          goto LAB_0048406e;
        }
      }
      CommsInterface::setTxStatus
                ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20));
      local_4d1 = 0;
      local_4d2 = 1;
      while ((local_4d2 & 1) != 0) {
        route_id::route_id(&local_4d8);
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
        ::pop((BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
               *)in_stack_fffffffffffff918._M_p);
        std::tie<helics::route_id,helics::ActionMessage>
                  (&in_stack_fffffffffffff738->first,
                   (ActionMessage *)in_stack_fffffffffffff730._M_node);
        std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                  ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)
                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   in_stack_fffffffffffff738);
        std::pair<helics::route_id,_helics::ActionMessage>::~pair
                  ((pair<helics::route_id,_helics::ActionMessage> *)0x483b09);
        bVar1 = isProtocolCommand((ActionMessage *)in_stack_fffffffffffff730._M_node);
        if (bVar1) {
          bVar1 = route_id::operator==(&local_4d8,(route_id)0xffffffff);
          if (!bVar1) goto LAB_00483dbc;
          if (local_590.messageID == 0xe9) {
            SendToQueue::SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
            sVar7 = SmallBuffer::to_string((SmallBuffer *)0x483bb5);
            this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      sVar7._M_str;
            __t = (basic_string_view<char,_std::char_traits<char>_> *)local_729;
            unique0x10000ef5 = sVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (this_00,__t,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
            iVar5 = SendToQueue::connect
                              ((SendToQueue *)&stack0xfffffffffffff910,(int)local_718,
                               (sockaddr *)0x0,3);
            in_stack_fffffffffffff764 = CONCAT13((char)iVar5,(int3)in_stack_fffffffffffff764);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff730._M_node);
            std::allocator<char>::~allocator((allocator<char> *)local_729);
            local_6f1 = (byte)(in_stack_fffffffffffff764 >> 0x18) & 1;
            if ((in_stack_fffffffffffff764 & 0x1000000) != 0) {
              in_stack_fffffffffffff760 = ActionMessage::getExtraData((ActionMessage *)0x483c6d);
              in_stack_fffffffffffff748 = (ActionMessage *)&stack0xfffffffffffff8d0;
              route_id::route_id((route_id *)in_stack_fffffffffffff748,in_stack_fffffffffffff760);
              pVar8 = std::
                      map<helics::route_id,helics::ipc::SendToQueue,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>>
                      ::emplace<helics::route_id,helics::ipc::SendToQueue>
                                ((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                                 &in_stack_fffffffffffff738->first,
                                 (SendToQueue *)in_stack_fffffffffffff730._M_node);
              local_740 = (_Base_ptr)pVar8.first._M_node;
              in_stack_fffffffffffff757 = pVar8.second;
              local_738 = in_stack_fffffffffffff757;
            }
            local_314 = 4;
            SendToQueue::~SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
          }
          else if (local_590.messageID == 0xf4) {
            in_stack_fffffffffffff744 = ActionMessage::getExtraData((ActionMessage *)0x483d60);
            in_stack_fffffffffffff738 =
                 (pair<helics::route_id,_helics::ActionMessage> *)&stack0xfffffffffffff8bc;
            route_id::route_id((route_id *)in_stack_fffffffffffff738,in_stack_fffffffffffff744);
            std::
            map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
            ::erase((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                     *)in_stack_fffffffffffff730._M_node,(key_type *)in_stack_fffffffffffff728);
            local_314 = 4;
          }
          else {
            if (local_590.messageID != 0x9db) goto LAB_00483dbc;
            local_4d2 = 0;
            local_314 = 4;
          }
        }
        else {
LAB_00483dbc:
          aVar6 = ActionMessage::action(&local_590);
          if ((aVar6 == cmd_init_grant) && ((local_4d1 & 1) == 0)) {
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                       (action_t)((ulong)in_stack_fffffffffffff748 >> 0x20));
            local_7fc = 0x20fc7;
            SendToQueue::sendMessage
                      ((SendToQueue *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                       in_stack_fffffffffffff748,in_stack_fffffffffffff744);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff730._M_node);
          }
          ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff788);
          bVar1 = isPriorityCommand((ActionMessage *)0x483e6e);
          local_824 = 1;
          if (bVar1) {
            local_824 = 3;
          }
          local_828 = 0;
          bVar1 = route_id::operator==(&local_4d8,(route_id)0x0);
          if (bVar1) {
            if ((local_211 & 1) != 0) {
              SendToQueue::sendMessage
                        ((SendToQueue *)
                         CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                         in_stack_fffffffffffff748,in_stack_fffffffffffff744);
            }
          }
          else {
            local_82c = 0xffffffff;
            bVar1 = route_id::operator==(&local_4d8,(route_id)0xffffffff);
            if (bVar1) {
              SendToQueue::sendMessage
                        ((SendToQueue *)
                         CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                         in_stack_fffffffffffff748,in_stack_fffffffffffff744);
            }
            else {
              in_stack_fffffffffffff730 =
                   std::
                   map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                   ::find((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                           *)in_stack_fffffffffffff728,(key_type *)0x483f62);
              local_838._M_node = in_stack_fffffffffffff730._M_node;
              local_840._M_node =
                   (_Base_ptr)
                   std::
                   map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                   ::end((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                          *)in_stack_fffffffffffff728);
              bVar1 = std::operator==(&local_838,&local_840);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                if ((local_211 & 1) != 0) {
                  SendToQueue::sendMessage
                            ((SendToQueue *)
                             CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                             in_stack_fffffffffffff748,in_stack_fffffffffffff744);
                }
              }
              else {
                std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>
                              *)0x483fb5);
                SendToQueue::sendMessage
                          ((SendToQueue *)
                           CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
                           in_stack_fffffffffffff748,in_stack_fffffffffffff744);
              }
            }
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730._M_node);
          local_314 = 0;
        }
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff730._M_node);
      }
      CommsInterface::setTxStatus
                ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20));
      local_314 = 0;
    }
  }
  else {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),
               (action_t)((ulong)in_stack_fffffffffffff748 >> 0x20));
    CVar3 = (ConnectionStatus)((ulong)in_stack_fffffffffffff738 >> 0x20);
    local_3cc = 0xfffffffe;
    SmallBuffer::operator=
              (in_stack_fffffffffffff758,
               (char (*) [29])CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750));
    std::function<void_(helics::ActionMessage_&&)>::operator()
              ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffff730._M_node,
               in_stack_fffffffffffff728);
    CommsInterface::setTxStatus
              ((CommsInterface *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),CVar3
              );
    local_314 = 1;
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff730._M_node);
  }
LAB_0048406e:
  std::
  map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  ::~map((map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
          *)0x48407b);
  SendToQueue::~SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
  SendToQueue::~SendToQueue((SendToQueue *)in_stack_fffffffffffff730._M_node);
  return;
}

Assistant:

void IpcComms::queue_tx_function()
    {
        SendToQueue brokerQueue;  //!< the queue of the broker
        SendToQueue rxQueue;
        std::map<route_id, SendToQueue> routes;  //!< table of the routes to other brokers
        bool hasBroker = false;

        if (!brokerTargetAddress.empty()) {
            bool conn = brokerQueue.connect(brokerTargetAddress, true, 20);
            if (!conn) {
                std::this_thread::sleep_for(connectionTimeout);
                conn = brokerQueue.connect(brokerTargetAddress, true, 20);
                if (!conn) {
                    ActionMessage err(CMD_ERROR);
                    err.payload = fmt::format("Unable to open broker connection -> {}",
                                              brokerQueue.getError());
                    err.messageID = defs::Errors::CONNECTION_FAILURE;
                    ActionCallback(std::move(err));
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
            hasBroker = true;
        }
        // wait for the receiver to STARTUP
        if (!rxTrigger.wait_forActivation(connectionTimeout)) {
            ActionMessage err(CMD_ERROR);
            err.messageID = defs::Errors::CONNECTION_FAILURE;
            err.payload = "Unable to link with receiver";
            ActionCallback(std::move(err));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (getRxStatus() == ConnectionStatus::ERRORED) {
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        bool conn = rxQueue.connect(localTargetAddress, false, 0);
        if (!conn) {
            /** lets try a reset of the receiver*/
            ipcbackchannel = IPC_BACKCHANNEL_TRY_RESET;
            while (ipcbackchannel != 0) {
                if (getRxStatus() != ConnectionStatus::CONNECTED) {
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }
            if (getRxStatus() == ConnectionStatus::CONNECTED) {
                conn = rxQueue.connect(localTargetAddress, false, 0);
            }
            if (!conn) {
                ActionMessage err(CMD_ERROR);
                err.messageID = defs::Errors::CONNECTION_FAILURE;
                err.payload =
                    fmt::format("Unable to open receiver connection -> {}", rxQueue.getError());
                ActionCallback(std::move(err));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        bool IPCoperating = false;
        bool continueLoop{true};
        while (continueLoop) {
            route_id rid;
            ActionMessage cmd;
            std::tie(rid, cmd) = txQueue.pop();
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            SendToQueue newQueue;
                            bool newQconnected =
                                newQueue.connect(std::string(cmd.payload.to_string()), false, 3);
                            if (newQconnected) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(newQueue));
                            }
                            continue;
                        }
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            continue;
                        case DISCONNECT:
                            continueLoop = false;
                            continue;
                    }
                }
            }
            if (cmd.action() == CMD_INIT_GRANT) {
                if (!IPCoperating) {
                    ActionMessage op(CMD_PROTOCOL);
                    op.messageID = SET_TO_OPERATING;
                    rxQueue.sendMessage(op, 3);
                }
            }
            std::string buffer = cmd.to_string();
            int priority = isPriorityCommand(cmd) ? 3 : 1;
            if (rid == parent_route_id) {
                if (hasBroker) {
                    brokerQueue.sendMessage(cmd, priority);
                }
            } else if (rid == control_route) {
                rxQueue.sendMessage(cmd, priority);
            } else {
                auto routeFnd = routes.find(rid);
                if (routeFnd != routes.end()) {
                    routeFnd->second.sendMessage(cmd, priority);
                } else {
                    if (hasBroker) {
                        brokerQueue.sendMessage(cmd, priority);
                    }
                }
            }
        }
        setTxStatus(ConnectionStatus::TERMINATED);
    }